

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

size_t __thiscall Assimp::CFIReaderImpl::parseNonEmptyOctetString7Length(CFIReaderImpl *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte *pbVar5;
  ulong uVar6;
  DeadlyImportError *this_00;
  size_t result;
  size_t b;
  CFIReaderImpl *this_local;
  
  pbVar5 = this->dataP;
  this->dataP = pbVar5 + 1;
  uVar6 = (ulong)(int)(*pbVar5 & 3);
  if ((uVar6 & 2) == 0) {
    return uVar6 + 1;
  }
  if (uVar6 == 2) {
    if (0 < (long)this->dataEnd - (long)this->dataP) {
      pbVar5 = this->dataP;
      this->dataP = pbVar5 + 1;
      return (long)(int)(*pbVar5 + 3);
    }
  }
  else if ((uVar6 == 3) && (3 < (long)this->dataEnd - (long)this->dataP)) {
    bVar1 = *this->dataP;
    bVar2 = this->dataP[1];
    bVar3 = this->dataP[2];
    bVar4 = this->dataP[3];
    this->dataP = this->dataP + 4;
    return (long)(int)(((uint)bVar1 << 0x18 | (uint)bVar2 << 0x10 | (uint)bVar3 << 8 | (uint)bVar4)
                      + 0x103);
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  DeadlyImportError::DeadlyImportError(this_00,(string *)parseErrorMessage_abi_cxx11_);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

size_t parseNonEmptyOctetString7Length() { // C.24
        // Parse the length of the string
        size_t b = *dataP++ & 0x03;
        if (!(b & 0x02)) { // xxxxxx0. (C.24.3.1)
            return b + 1;
        }
        else if (b == 0x02) { // xxxxxx10 ........ (C.24.3.2)
            if (dataEnd - dataP > 0) {
                return *dataP++ + 0x3;
            }
        }
        else if (b == 0x03) { // xxxxxx11 ........ ........ ........ ........ (C.24.3.3)
            if (dataEnd - dataP > 3) {
                size_t result = ((dataP[0] << 24) | (dataP[1] << 16) | (dataP[2] << 8) | dataP[3]) + 0x103;
                dataP += 4;
                return result;
            }
        }
        throw DeadlyImportError(parseErrorMessage);
    }